

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O2

void Logger::printLine<int,unsigned_long>(wchar_t *text,int *args,unsigned_long *args_1)

{
  wstring message;
  wstring wStack_28;
  
  formatString<int,unsigned_long>(&wStack_28,text,args,args_1);
  printLine(&wStack_28);
  std::__cxx11::wstring::~wstring((wstring *)&wStack_28);
  return;
}

Assistant:

static void printLine(const wchar_t* text, const Args&... args)
	{
		std::wstring message = formatString(text,args...);
		printLine(message);
	}